

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

command * __thiscall
libchars::command_set::add
          (command_set *this,string *cmd_str,char *name,id_t ID,filter_t mask_,bool hidden_)

{
  token *__p;
  pointer ptVar1;
  ulong uVar2;
  debug *this_00;
  double __x;
  command *c_new;
  undefined1 local_78 [8];
  string cmd_str_sanitized;
  token *T;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> local_48;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> Tadd;
  bool hidden__local;
  filter_t mask__local;
  id_t ID_local;
  char *name_local;
  string *cmd_str_local;
  command_set *this_local;
  
  if ((name == (char *)0x0) && (ID == -1)) {
    this_local = (command_set *)0x0;
  }
  else {
    Tadd._M_t.super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t.
    super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
    super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl._7_1_ = hidden_;
    __p = lexer(cmd_str);
    std::unique_ptr<libchars::token,std::default_delete<libchars::token>>::
    unique_ptr<std::default_delete<libchars::token>,void>
              ((unique_ptr<libchars::token,std::default_delete<libchars::token>> *)&local_48,__p);
    ptVar1 = std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::get(&local_48)
    ;
    if (ptVar1 == (pointer)0x0) {
      this_local = (command_set *)0x0;
    }
    else {
      for (cmd_str_sanitized.field_2._8_8_ =
                std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::get
                          (&local_48); cmd_str_sanitized.field_2._8_8_ != 0;
          cmd_str_sanitized.field_2._8_8_ = *(undefined8 *)(cmd_str_sanitized.field_2._8_8_ + 0x88))
      {
        if ((*(uint *)(cmd_str_sanitized.field_2._8_8_ + 0x6c) & 0x400) != 0) {
          this_local = (command_set *)0x0;
          goto LAB_00127e58;
        }
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          this_local = (command_set *)0x0;
          goto LAB_00127e58;
        }
      }
      cmd_str_sanitized.field_2._8_8_ =
           std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::get(&local_48);
      std::__cxx11::string::string((string *)local_78,(string *)cmd_str_sanitized.field_2._8_8_);
      for (cmd_str_sanitized.field_2._8_8_ = *(undefined8 *)(cmd_str_sanitized.field_2._8_8_ + 0x88)
          ; cmd_str_sanitized.field_2._8_8_ != 0;
          cmd_str_sanitized.field_2._8_8_ = *(undefined8 *)(cmd_str_sanitized.field_2._8_8_ + 0x88))
      {
        std::__cxx11::string::operator+=((string *)local_78,' ');
        std::__cxx11::string::append((string *)local_78);
      }
      this->dirty = true;
      this_local = (command_set *)operator_new(0x98);
      command::command((command *)this_local,(string *)local_78,name,mask_,ID,
                       (bool)(Tadd._M_t.
                              super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                              .super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl._7_1_ &
                             1));
      this_00 = debug::initialize(0);
      __x = (double)std::__cxx11::string::c_str();
      debug::log(this_00,__x);
      if (this->C_list != (command *)0x0) {
        ((command *)this_local)->next = this->C_list;
      }
      this->C_list = (command *)this_local;
      std::__cxx11::string::~string((string *)local_78);
    }
LAB_00127e58:
    std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::~unique_ptr(&local_48);
  }
  return (command *)this_local;
}

Assistant:

command* command_set::add(const std::string &cmd_str, const char *name, token::id_t ID, command::filter_t mask_, bool hidden_)
    {
        if (name != NULL || ID != token::ID_NOT_SET) {
            // break command string into tokens
            std::unique_ptr<token> Tadd(libchars::lexer(cmd_str));
            if (Tadd.get() == NULL)
                return NULL;
            // make sure none of the tokens are quoted strings nor empty strings
            token *T = Tadd.get();
            while (T != NULL) {
                if (T->status & token::IS_QUOTED)
                    return NULL;
                if (T->value.empty())
                    return NULL;
                T = T->next;
            }
            // build sanitized version of command string
            T = Tadd.get();
            std::string cmd_str_sanitized(T->value);
            T = T->next;
            while (T != NULL) {
                cmd_str_sanitized += ' ';
                cmd_str_sanitized.append(T->value);
                T = T->next;
            }
            // add command to internal list
            dirty = true;
            command *c_new = new command(cmd_str_sanitized, name, mask_, ID, hidden_);
            LC_LOG_VERBOSE("set[%p] command[%s] = %p",this,cmd_str_sanitized.c_str(),c_new);
            if (C_list != NULL)
                c_new->next = C_list;
            C_list = c_new;
            return c_new;
        }
        return NULL;
    }